

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O0

vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *
libtorrent::session_stats_metrics(void)

{
  int iVar1;
  char *pcVar2;
  size_type s;
  long lVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *in_RDI;
  int local_38;
  int i;
  undefined1 local_28 [8];
  vector<stats_metric> stats;
  
  aux::
  container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  ::container_wrapper((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
                       *)local_28);
  s = ::std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>::size
                ((array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL> *)
                 (anonymous_namespace)::metrics);
  aux::
  container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  ::resize((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
            *)local_28,s);
  local_38 = 0;
  while( true ) {
    lVar3 = aux::
            container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
            ::end_index((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                         *)(anonymous_namespace)::metrics);
    if (lVar3 <= local_38) break;
    pvVar4 = aux::
             container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
             ::operator[]((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                           *)(anonymous_namespace)::metrics,(long)local_38);
    pcVar2 = pvVar4->name;
    pvVar5 = aux::
             container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
             ::operator[]((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
                           *)local_28,local_38);
    pvVar5->name = pcVar2;
    pvVar4 = aux::
             container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
             ::operator[]((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                           *)(anonymous_namespace)::metrics,(long)local_38);
    iVar1 = pvVar4->value_index;
    pvVar5 = aux::
             container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
             ::operator[]((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
                           *)local_28,local_38);
    pvVar5->value_index = iVar1;
    pvVar4 = aux::
             container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
             ::operator[]((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                           *)(anonymous_namespace)::metrics,(long)local_38);
    iVar1 = pvVar4->value_index;
    pvVar5 = aux::
             container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
             ::operator[]((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
                           *)local_28,local_38);
    pvVar5->type = (uint)(0xd2 < iVar1);
    local_38 = local_38 + 1;
  }
  ::std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::vector
            (in_RDI,(vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *)
                    local_28);
  aux::
  container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  ::~container_wrapper
            ((container_wrapper<libtorrent::stats_metric,_int,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
              *)local_28);
  return in_RDI;
}

Assistant:

std::vector<stats_metric> session_stats_metrics()
	{
		aux::vector<stats_metric> stats;
		stats.resize(metrics.size());
		for (int i = 0; i < metrics.end_index(); ++i)
		{
			stats[i].name = metrics[i].name;
			stats[i].value_index = metrics[i].value_index;
			stats[i].type = metrics[i].value_index >= counters::num_stats_counters
				? metric_type_t::gauge : metric_type_t::counter;
		}
		return TORRENT_RVO(stats);
	}